

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_hash.h
# Opt level: O0

size_t __thiscall
std::hash<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>::operator()
          (hash<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_> *this,
          AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *x)

{
  size_t sVar1;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *in_RSI;
  AlgConRhs<0> this_00;
  HashStreamer hs;
  unsigned_long *in_stack_ffffffffffffffb8;
  AlgConRhs<0> in_stack_ffffffffffffffc0;
  QuadAndLinTerms *in_stack_ffffffffffffffe8;
  
  mp::HashStreamerCombine::HashStreamerCombine((HashStreamerCombine *)&stack0xffffffffffffffe0,0);
  mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::GetBody(in_RSI);
  hash<mp::QuadAndLinTerms>::operator()
            ((hash<mp::QuadAndLinTerms> *)in_RSI,in_stack_ffffffffffffffe8);
  mp::HashStreamerCombine::Add<unsigned_long>
            ((HashStreamerCombine *)in_stack_ffffffffffffffc0.rhs_,in_stack_ffffffffffffffb8);
  this_00 = mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::GetRhsOrRange(in_RSI);
  hash<mp::AlgConRhs<0>_>::operator()
            ((hash<mp::AlgConRhs<0>_> *)this_00.rhs_,in_stack_ffffffffffffffc0);
  mp::HashStreamerCombine::Add<unsigned_long>
            ((HashStreamerCombine *)in_stack_ffffffffffffffc0.rhs_,(unsigned_long *)this_00.rhs_);
  sVar1 = mp::HashStreamerCombine::FinalizeHashValue
                    ((HashStreamerCombine *)&stack0xffffffffffffffe0);
  return sVar1;
}

Assistant:

size_t operator()(
        const mp::AlgebraicConstraint<Body, RangeOrRhs>& x) const
  {
    mp::HashStreamer hs;
    hs.Add(std::hash<Body>{}(x.GetBody()));
    hs.Add(std::hash<RangeOrRhs>{}(x.GetRhsOrRange()));
    return hs.FinalizeHashValue();
  }